

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O1

void TTD::NSSnapValues::ExtractFunctionBodyInfo
               (FunctionBodyResolveInfo *fbInfo,FunctionBody *fb,bool isWellKnown,
               SlabAllocator *alloc)

{
  int iVar1;
  uint32 length;
  ULONG UVar2;
  ScriptContext *pSVar3;
  undefined4 extraout_var;
  TTD_WELLKNOWN_TOKEN str;
  char16 *pcVar4;
  FunctionBody *pFVar5;
  
  fbInfo->FunctionBodyId = (TTD_PTR_ID)fb;
  pSVar3 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)fb);
  fbInfo->ScriptContextLogId = pSVar3->ScriptContextLogTag;
  iVar1 = (*(fb->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(fb);
  length = (*(fb->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[8])(fb);
  SlabAllocatorBase<0>::CopyStringIntoWLength
            (alloc,(char16 *)CONCAT44(extraout_var,iVar1),length,&fbInfo->FunctionName);
  iVar1 = PAL_wcscmp((fbInfo->FunctionName).Contents,L"Global code");
  if (iVar1 == 0) {
    TTDAbort_unrecoverable_error("Why are we snapshotting global code??");
  }
  if (isWellKnown) {
    pSVar3 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)fb);
    str = RuntimeContextInfo::ResolvePathForKnownFunctionBody(pSVar3->TTDWellKnownInfo,fb);
    pcVar4 = SlabAllocatorBase<0>::CopyRawNullTerminatedStringInto(alloc,str);
    fbInfo->OptKnownPath = pcVar4;
    fbInfo->OptParentBodyId = 0;
    *(undefined4 *)&fbInfo->OptLine = 0xffffffff;
    *(undefined4 *)((long)&fbInfo->OptLine + 4) = 0xffffffff;
    *(undefined4 *)&fbInfo->OptColumn = 0xffffffff;
    *(undefined4 *)((long)&fbInfo->OptColumn + 4) = 0xffffffff;
  }
  else {
    fbInfo->OptKnownPath = (TTD_WELLKNOWN_TOKEN)0x0;
    pSVar3 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)fb);
    pFVar5 = ScriptContextTTD::ResolveParentBody(pSVar3->TTDContextInfo,fb);
    if (pFVar5 == (FunctionBody *)0x0) {
      TTDAbort_unrecoverable_error("We missed something!!!");
    }
    fbInfo->OptParentBodyId = (TTD_PTR_ID)pFVar5;
    UVar2 = Js::ParseableFunctionInfo::GetLineNumber(&fb->super_ParseableFunctionInfo);
    fbInfo->OptLine = (ulong)UVar2;
    UVar2 = Js::ParseableFunctionInfo::GetColumnNumber(&fb->super_ParseableFunctionInfo);
    fbInfo->OptColumn = (ulong)UVar2;
  }
  ExtractSnapFunctionBodyScopeChain
            (fbInfo->OptKnownPath != (TTD_WELLKNOWN_TOKEN)0x0,&fbInfo->ScopeChainInfo,fb,alloc);
  return;
}

Assistant:

void ExtractFunctionBodyInfo(FunctionBodyResolveInfo* fbInfo, Js::FunctionBody* fb, bool isWellKnown, SlabAllocator& alloc)
        {
            fbInfo->FunctionBodyId = TTD_CONVERT_FUNCTIONBODY_TO_PTR_ID(fb);
            fbInfo->ScriptContextLogId = fb->GetScriptContext()->ScriptContextLogTag;

            alloc.CopyStringIntoWLength(fb->GetDisplayName(), fb->GetDisplayNameLength(), fbInfo->FunctionName);
            TTDAssert(wcscmp(fbInfo->FunctionName.Contents, Js::Constants::GlobalCode) != 0, "Why are we snapshotting global code??");

            if(isWellKnown)
            {
                fbInfo->OptKnownPath = alloc.CopyRawNullTerminatedStringInto(fb->GetScriptContext()->TTDWellKnownInfo->ResolvePathForKnownFunctionBody(fb));

                fbInfo->OptParentBodyId = TTD_INVALID_PTR_ID;
                fbInfo->OptLine = -1;
                fbInfo->OptColumn = -1;
            }
            else
            {
                fbInfo->OptKnownPath = TTD_INVALID_WELLKNOWN_TOKEN;

                Js::FunctionBody* parentBody = fb->GetScriptContext()->TTDContextInfo->ResolveParentBody(fb);
                TTDAssert(parentBody != nullptr, "We missed something!!!");

                fbInfo->OptParentBodyId = TTD_CONVERT_FUNCTIONBODY_TO_PTR_ID(parentBody);
                fbInfo->OptLine = fb->GetLineNumber();
                fbInfo->OptColumn = fb->GetColumnNumber();
            }

            ExtractSnapFunctionBodyScopeChain(fbInfo->OptKnownPath != TTD_INVALID_WELLKNOWN_TOKEN, fbInfo->ScopeChainInfo, fb, alloc);
        }